

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_factory.hpp
# Opt level: O2

s2_grid_ptr __thiscall IntegratorXX::S2Factory::generate(S2Factory *this,AngularQuad aq,size_t npts)

{
  runtime_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  s2_grid_ptr sVar2;
  unique_ptr<IntegratorXX::AhrensBeylkin<double>,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
  local_20;
  size_t npts_local;
  
  npts_local = npts;
  switch(aq << 0x18 | aq - AhrensBeylkin >> 8) {
  case 0:
    std::make_unique<IntegratorXX::AhrensBeylkin<double>,unsigned_long&>((unsigned_long *)&local_20)
    ;
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::AhrensBeylkin<double>,std::default_delete<IntegratorXX::AhrensBeylkin<double>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this,&local_20);
    std::
    unique_ptr<IntegratorXX::AhrensBeylkin<double>,_std::default_delete<IntegratorXX::AhrensBeylkin<double>_>_>
    ::~unique_ptr(&local_20);
    _Var1._M_pi = extraout_RDX;
    break;
  case 1:
    std::make_unique<IntegratorXX::Delley<double>,unsigned_long&>((unsigned_long *)&local_20);
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::Delley<double>,std::default_delete<IntegratorXX::Delley<double>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this,(unique_ptr<IntegratorXX::Delley<double>,_std::default_delete<IntegratorXX::Delley<double>_>_>
                        *)&local_20);
    std::
    unique_ptr<IntegratorXX::Delley<double>,_std::default_delete<IntegratorXX::Delley<double>_>_>::
    ~unique_ptr((unique_ptr<IntegratorXX::Delley<double>,_std::default_delete<IntegratorXX::Delley<double>_>_>
                 *)&local_20);
    _Var1._M_pi = extraout_RDX_02;
    break;
  case 2:
    std::make_unique<IntegratorXX::LebedevLaikov<double>,unsigned_long&>((unsigned_long *)&local_20)
    ;
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::LebedevLaikov<double>,std::default_delete<IntegratorXX::LebedevLaikov<double>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this,(unique_ptr<IntegratorXX::LebedevLaikov<double>,_std::default_delete<IntegratorXX::LebedevLaikov<double>_>_>
                        *)&local_20);
    std::
    unique_ptr<IntegratorXX::LebedevLaikov<double>,_std::default_delete<IntegratorXX::LebedevLaikov<double>_>_>
    ::~unique_ptr((unique_ptr<IntegratorXX::LebedevLaikov<double>,_std::default_delete<IntegratorXX::LebedevLaikov<double>_>_>
                   *)&local_20);
    _Var1._M_pi = extraout_RDX_00;
    break;
  case 3:
    std::make_unique<IntegratorXX::Womersley<double>,unsigned_long&>((unsigned_long *)&local_20);
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::Womersley<double>,std::default_delete<IntegratorXX::Womersley<double>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this,(unique_ptr<IntegratorXX::Womersley<double>,_std::default_delete<IntegratorXX::Womersley<double>_>_>
                        *)&local_20);
    std::
    unique_ptr<IntegratorXX::Womersley<double>,_std::default_delete<IntegratorXX::Womersley<double>_>_>
    ::~unique_ptr((unique_ptr<IntegratorXX::Womersley<double>,_std::default_delete<IntegratorXX::Womersley<double>_>_>
                   *)&local_20);
    _Var1._M_pi = extraout_RDX_01;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unsupported Angular Quadrature");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar2.
  super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  sVar2.
  super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (s2_grid_ptr)
         sVar2.
         super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

S2Factory::s2_grid_ptr S2Factory::generate(AngularQuad aq, size_t npts) {

  switch(aq) {
    case AngularQuad::AhrensBeylkin:
      return std::make_unique<ah_type>(npts);
    case AngularQuad::Delley:
      return std::make_unique<de_type>(npts);
    case AngularQuad::LebedevLaikov:
      return std::make_unique<ll_type>(npts);
    case AngularQuad::Womersley:
      return std::make_unique<wo_type>(npts);
    default:
      throw std::runtime_error("Unsupported Angular Quadrature");
      abort();
  } 
}